

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

ssize_t httplib::detail::select_write(socket_t sock,time_t sec,time_t usec)

{
  anon_class_24_3_42bc4be6 fn;
  uint __i;
  long lVar1;
  ssize_t sVar2;
  undefined4 uStack_b0;
  socket_t sock_local;
  socket_t *local_a8;
  timeval *ptStack_a0;
  timeval *local_98;
  timeval tv;
  fd_set fds;
  
  if (sock < 0x400) {
    for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
      fds.fds_bits[lVar1] = 0;
    }
    fds.fds_bits[sock / 0x40] = fds.fds_bits[sock / 0x40] | 1L << ((byte)sock & 0x3f);
    local_98 = &tv;
    local_a8 = &sock_local;
    ptStack_a0 = (timeval *)&fds;
    fn.sock._4_4_ = sock;
    fn.sock._0_4_ = uStack_b0;
    fn.fds = (fd_set *)local_a8;
    fn.tv = ptStack_a0;
    sock_local = sock;
    tv.tv_sec = sec;
    tv.tv_usec = usec;
    sVar2 = handle_EINTR<httplib::detail::select_write(int,long,long)::_lambda()_1_>(fn);
  }
  else {
    sVar2 = 1;
  }
  return sVar2;
}

Assistant:

inline ssize_t select_write(socket_t sock, time_t sec, time_t usec) {
#ifdef CPPHTTPLIB_USE_POLL
  struct pollfd pfd_read;
  pfd_read.fd = sock;
  pfd_read.events = POLLOUT;

  auto timeout = static_cast<int>(sec * 1000 + usec / 1000);

  return handle_EINTR([&]() { return poll(&pfd_read, 1, timeout); });
#else
#ifndef _WIN32
  if (sock >= FD_SETSIZE) { return 1; }
#endif

  fd_set fds;
  FD_ZERO(&fds);
  FD_SET(sock, &fds);

  timeval tv;
  tv.tv_sec = static_cast<long>(sec);
  tv.tv_usec = static_cast<decltype(tv.tv_usec)>(usec);

  return handle_EINTR([&]() {
    return select(static_cast<int>(sock + 1), nullptr, &fds, nullptr, &tv);
  });
#endif
}